

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  float *pfVar1;
  pointer pPVar2;
  long lVar3;
  ulong uVar4;
  ulong __n;
  float fVar5;
  Random rnd;
  allocator_type local_e9;
  float local_e8;
  float local_d8;
  float local_c8;
  Vec4 local_b8;
  Vec4 local_a8;
  PositionColorVertex local_98;
  Vec4 local_78;
  Vec4 local_68;
  deRandom local_58;
  _Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  local_48;
  
  deRandom_init(&local_58,
                *(uint *)&(this->m_data).field_0x24 ^
                *(uint *)&(this->m_data).super_DrawParamsBase.field_0x1c ^ 0xc2a39f);
  __n = (ulong)(uint)(*(int *)&(this->m_data).super_DrawParamsBase.field_0x1c +
                     *(int *)&(this->m_data).field_0x24);
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 0.0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  PositionColorVertex::PositionColorVertex(&local_98,&local_68,&local_78);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         &local_48,__n,&local_98,&local_e9);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  _M_move_assign((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&this->m_data,&local_48);
  std::_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ::~_Vector_base(&local_48);
  uVar4 = (ulong)*(uint *)&(this->m_data).field_0x24;
  lVar3 = uVar4 << 5;
  for (; uVar4 < __n; uVar4 = uVar4 + 1) {
    local_e8 = deRandom_getFloat(&local_58);
    fVar5 = deRandom_getFloat(&local_58);
    local_a8.m_data[0] = local_e8 + local_e8 + -1.0;
    local_a8.m_data[1] = fVar5 + fVar5 + -1.0;
    local_a8.m_data[2] = 1.0;
    local_a8.m_data[3] = 1.0;
    local_e8 = deRandom_getFloat(&local_58);
    local_c8 = deRandom_getFloat(&local_58);
    local_d8 = deRandom_getFloat(&local_58);
    local_b8.m_data[3] = deRandom_getFloat(&local_58);
    local_b8.m_data[0] = local_e8 + 0.0;
    local_b8.m_data[1] = local_c8 + 0.0;
    local_b8.m_data[2] = local_d8 + 0.0;
    local_b8.m_data[3] = local_b8.m_data[3] + 0.0;
    PositionColorVertex::PositionColorVertex(&local_98,&local_a8,&local_b8);
    pPVar2 = (this->m_data).super_DrawParamsBase.vertices.
             super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar1 = (float *)((long)&pPVar2->color + lVar3);
    *(undefined8 *)pfVar1 = local_98.color.m_data._0_8_;
    *(undefined8 *)(pfVar1 + 2) = local_98.color.m_data._8_8_;
    pfVar1 = (float *)((long)&pPVar2->position + lVar3);
    *(undefined8 *)pfVar1 = local_98.position.m_data._0_8_;
    *(undefined8 *)(pfVar1 + 2) = local_98.position.m_data._8_8_;
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void DrawTestInstance<DrawParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.params.firstVertex ^ m_data.params.vertexCount);

	const deUint32	vectorSize	= m_data.params.firstVertex + m_data.params.vertexCount;

	// Initialize the vector
	m_data.vertices = std::vector<PositionColorVertex>(vectorSize, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Fill only the used indexes
	for (deUint32 vertexIdx = m_data.params.firstVertex; vertexIdx < vectorSize; ++vertexIdx)
	{
		m_data.vertices[vertexIdx] = PositionColorVertex(
			tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0),										// Coord
			tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0)));	// Color
	}
}